

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_redundancy_elimination.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::LocalRedundancyEliminationPass::Process(LocalRedundancyEliminationPass *this)

{
  bool bVar1;
  Status SVar2;
  IRContext *ctx;
  Module *this_00;
  reference this_01;
  undefined1 local_128 [8];
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  value_to_ids;
  value_type *bb;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  value_type *func;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  ValueNumberTable vnTable;
  bool modified;
  LocalRedundancyEliminationPass *this_local;
  
  vnTable._127_1_ = 0;
  ctx = Pass::context(&this->super_Pass);
  ValueNumberTable::ValueNumberTable((ValueNumberTable *)&__range2,ctx);
  this_00 = Pass::get_module(&this->super_Pass);
  join_0x00000010_0x00000000_ = Module::begin(this_00);
  _func = Module::end(this_00);
  while (bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                           ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                            (UptrVectorIterator<spvtools::opt::Function,_false> *)&func), bVar1) {
    this_01 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    join_0x00000010_0x00000000_ = opt::Function::begin(this_01);
    _bb = opt::Function::end(this_01);
    while (bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                              &__end3.iterator_,
                              (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&bb), bVar1) {
      value_to_ids._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                              &__end3.iterator_);
      std::
      map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             *)local_128);
      bVar1 = EliminateRedundanciesInBB
                        (this,(BasicBlock *)
                              value_to_ids._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (ValueNumberTable *)&__range2,
                         (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)local_128);
      if (bVar1) {
        vnTable._127_1_ = 1;
      }
      std::
      map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              *)local_128);
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_);
    }
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  SVar2 = SuccessWithoutChange;
  if ((vnTable._127_1_ & 1) != 0) {
    SVar2 = SuccessWithChange;
  }
  ValueNumberTable::~ValueNumberTable((ValueNumberTable *)&__range2);
  return SVar2;
}

Assistant:

Pass::Status LocalRedundancyEliminationPass::Process() {
  bool modified = false;
  ValueNumberTable vnTable(context());

  for (auto& func : *get_module()) {
    for (auto& bb : func) {
      // Keeps track of all ids that contain a given value number. We keep
      // track of multiple values because they could have the same value, but
      // different decorations.
      std::map<uint32_t, uint32_t> value_to_ids;
      if (EliminateRedundanciesInBB(&bb, vnTable, &value_to_ids))
        modified = true;
    }
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}